

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DeviceContextGLImpl.cpp
# Opt level: O2

void __thiscall
Diligent::DeviceContextGLImpl::DispatchCompute
          (DeviceContextGLImpl *this,DispatchComputeAttribs *Attribs)

{
  byte bVar1;
  GLenum err;
  string msg;
  uint local_44;
  string local_40;
  
  DeviceContextBase<Diligent::EngineGLImplTraits>::DispatchCompute
            (&this->super_DeviceContextBase<Diligent::EngineGLImplTraits>,Attribs,0);
  PipelineStateGLImpl::CommitProgram
            ((this->super_DeviceContextBase<Diligent::EngineGLImplTraits>).m_pPipelineState.
             m_pObject,&this->m_ContextState);
  bVar1 = DeviceContextBase<Diligent::EngineGLImplTraits>::CommittedShaderResources::GetCommitMask
                    (&(this->m_BindInfo).super_CommittedShaderResources,false);
  if (bVar1 != 0) {
    BindProgramResources(this,(uint)bVar1);
  }
  DvpValidateCommittedShaderResources(this);
  if (((Attribs->ThreadGroupCountX != 0) && (Attribs->ThreadGroupCountY != 0)) &&
     (Attribs->ThreadGroupCountZ != 0)) {
    (*__glewDispatchCompute)
              (Attribs->ThreadGroupCountX,Attribs->ThreadGroupCountY,Attribs->ThreadGroupCountZ);
    local_44 = glGetError();
    if (local_44 != 0) {
      LogError<false,char[27],char[17],unsigned_int>
                (false,"DispatchCompute",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/src/DeviceContextGLImpl.cpp"
                 ,0x555,(char (*) [27])"glDispatchCompute() failed",
                 (char (*) [17])"\nGL Error Code: ",&local_44);
      FormatString<char[6]>(&local_40,(char (*) [6])0x731c01);
      DebugAssertionFailed
                (local_40._M_dataplus._M_p,"DispatchCompute",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/src/DeviceContextGLImpl.cpp"
                 ,0x555);
      std::__cxx11::string::~string((string *)&local_40);
    }
  }
  PostDraw(this);
  return;
}

Assistant:

void DeviceContextGLImpl::DispatchCompute(const DispatchComputeAttribs& Attribs)
{
    TDeviceContextBase::DispatchCompute(Attribs, 0);

#if GL_ARB_compute_shader
    // The program might have changed since the last SetPipelineState call if a shader was
    // created after the call (ShaderResourcesGL needs to bind a program to load uniforms).
    m_pPipelineState->CommitProgram(m_ContextState);
    if (Uint32 BindSRBMask = m_BindInfo.GetCommitMask())
    {
        BindProgramResources(BindSRBMask);
    }

#    ifdef DILIGENT_DEVELOPMENT
    // Must be called after BindProgramResources as it needs BaseBindings
    DvpValidateCommittedShaderResources();
#    endif

    if (Attribs.ThreadGroupCountX > 0 && Attribs.ThreadGroupCountY > 0 && Attribs.ThreadGroupCountZ > 0)
    {
        glDispatchCompute(Attribs.ThreadGroupCountX, Attribs.ThreadGroupCountY, Attribs.ThreadGroupCountZ);
        DEV_CHECK_GL_ERROR("glDispatchCompute() failed");
    }

    PostDraw();
#else
    UNSUPPORTED("Compute shaders are not supported");
#endif
}